

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_init_do(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  CURLcode CVar2;
  uint uVar3;
  curltime cVar4;
  
  CVar2 = Curl_preconnect(data);
  if (CVar2 == CURLE_OK) {
    if (conn == (connectdata *)0x0) {
      uVar3 = *(uint *)&(data->state).field_0x74c;
    }
    else {
      puVar1 = &(conn->bits).field_0x1;
      *puVar1 = *puVar1 & 0xdf;
      uVar3 = *(uint *)&(data->state).field_0x74c;
      if (((uVar3 & 0x40) != 0) && ((conn->handler->flags & 0x1000) == 0)) {
        uVar3 = uVar3 & 0xffffffbf;
      }
    }
    *(uint *)&(data->state).field_0x74c = uVar3 & 0xfffff77f;
    if (((data->req).field_0xbc & 0x10) != 0) {
      (data->state).httpreq = '\x05';
    }
    cVar4 = Curl_now();
    (data->req).start.tv_sec = cVar4.tv_sec;
    (data->req).start.tv_usec = cVar4.tv_usec;
    (data->req).bytecount = 0;
    *(ushort *)&(data->req).field_0xbb = (*(ushort *)&(data->req).field_0xbb & 0xffde) + 1;
    Curl_client_cleanup(data);
    Curl_speedinit(data);
    Curl_pgrsSetUploadCounter(data,0);
    Curl_pgrsSetDownloadCounter(data,0);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_init_do(struct Curl_easy *data, struct connectdata *conn)
{
  struct SingleRequest *k = &data->req;

  /* if this is a pushed stream, we need this: */
  CURLcode result = Curl_preconnect(data);
  if(result)
    return result;

  if(conn) {
    conn->bits.do_more = FALSE; /* by default there's no curl_do_more() to
                                   use */
    /* if the protocol used doesn't support wildcards, switch it off */
    if(data->state.wildcardmatch &&
       !(conn->handler->flags & PROTOPT_WILDCARD))
      data->state.wildcardmatch = FALSE;
  }

  data->state.done = FALSE; /* *_done() is not called yet */
  data->state.expect100header = FALSE;

  if(data->req.no_body)
    /* in HTTP lingo, no body means using the HEAD request... */
    data->state.httpreq = HTTPREQ_HEAD;

  k->start = Curl_now(); /* start time */
  k->header = TRUE; /* assume header */
  k->bytecount = 0;
  k->ignorebody = FALSE;

  Curl_client_cleanup(data);
  Curl_speedinit(data);
  Curl_pgrsSetUploadCounter(data, 0);
  Curl_pgrsSetDownloadCounter(data, 0);

  return CURLE_OK;
}